

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::dht_live_nodes_alert::dht_live_nodes_alert
          (dht_live_nodes_alert *this,stack_allocator *alloc,sha1_hash *nid,
          vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          *nodes)

{
  pointer ppVar1;
  tuple<int_&,_libtorrent::aux::allocation_slot_&,_int_&,_libtorrent::aux::allocation_slot_&>
  local_68;
  tuple<int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot> local_38;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *local_28;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *nodes_local;
  sha1_hash *nid_local;
  stack_allocator *alloc_local;
  dht_live_nodes_alert *this_local;
  
  local_28 = nodes;
  nodes_local = (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                 *)nid;
  nid_local = (sha1_hash *)alloc;
  alloc_local = (stack_allocator *)this;
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_live_nodes_alert_00992110;
  (this->node_id).m_number._M_elems[4] =
       *(uint *)&(nodes_local->
                 super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar1 = (nodes_local->
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(this->node_id).m_number._M_elems =
       (nodes_local->
       super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((this->node_id).m_number._M_elems + 2) = ppVar1;
  std::reference_wrapper<libtorrent::aux::stack_allocator>::
  reference_wrapper<libtorrent::aux::stack_allocator&,void,libtorrent::aux::stack_allocator*>
            (&this->m_alloc,(stack_allocator *)nid_local);
  this->m_v4_num_nodes = 0;
  this->m_v6_num_nodes = 0;
  libtorrent::aux::allocation_slot::allocation_slot(&this->m_v4_nodes_idx);
  libtorrent::aux::allocation_slot::allocation_slot(&this->m_v6_nodes_idx);
  anon_unknown_62::write_nodes((anon_unknown_62 *)&local_38,(stack_allocator *)nid_local,local_28);
  std::tie<int,libtorrent::aux::allocation_slot,int,libtorrent::aux::allocation_slot>
            (&local_68,&this->m_v4_num_nodes,&this->m_v4_nodes_idx,&this->m_v6_num_nodes,
             &this->m_v6_nodes_idx);
  std::tuple<int&,libtorrent::aux::allocation_slot&,int&,libtorrent::aux::allocation_slot&>::
  operator=((tuple<int&,libtorrent::aux::allocation_slot&,int&,libtorrent::aux::allocation_slot&> *)
            &local_68,&local_38);
  return;
}

Assistant:

dht_live_nodes_alert::dht_live_nodes_alert(aux::stack_allocator& alloc
		, sha1_hash const& nid
		, std::vector<std::pair<sha1_hash, udp::endpoint>> const& nodes)
		: node_id(nid)
		, m_alloc(alloc)
	{
		std::tie(m_v4_num_nodes, m_v4_nodes_idx, m_v6_num_nodes, m_v6_nodes_idx)
			= write_nodes(alloc, nodes);
	}